

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::DeleteProgram::DeleteProgram
          (DeleteProgram *this,SharedPtr<deqp::egl::GLES2ThreadTest::Program> *program,bool useSync,
          bool serverSync)

{
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_28;
  
  Operation::Operation(&this->super_Operation,"DeleteProgram",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__DeleteProgram_01e08618;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr(&this->m_program,program);
  local_28.m_ptr = &((this->m_program).m_ptr)->super_Object;
  local_28.m_state = (this->m_program).m_state;
  if (local_28.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_28.m_state)->strongRefCount = (local_28.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_28.m_state)->weakRefCount = (local_28.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::modifyGLObject(&this->super_Operation,&local_28);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::release(&local_28);
  return;
}

Assistant:

DeleteProgram::DeleteProgram (SharedPtr<Program> program, bool useSync, bool serverSync)
	: Operation	("DeleteProgram", useSync, serverSync)
	, m_program	(program)
{
	modifyGLObject(SharedPtr<Object>(m_program));
}